

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O1

uint __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
::bubbleDown(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
             *this,uint index)

{
  UnresolvedSplitRecord *pUVar1;
  UnresolvedSplitRecord *pUVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Comparison CVar8;
  uint uVar9;
  UnresolvedSplitRecord *pUVar10;
  
  uVar3 = index * 2;
  uVar9 = this->_size;
  if (uVar3 <= uVar9) {
    do {
      if (uVar3 == uVar9) {
LAB_00313406:
        CVar8 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>::compare
                          (this->_data1 + index,this->_data1 + uVar3);
        if (CVar8 != GREATER) {
          return index;
        }
        pUVar2 = this->_data1;
        pUVar1 = pUVar2 + index;
        uVar9 = pUVar1->var;
        uVar7 = *(undefined4 *)&pUVar1->field_0x4;
        uVar4 = (pUVar1->original)._content;
        pUVar1 = pUVar2 + uVar3;
        uVar6 = *(undefined4 *)&pUVar1->field_0x4;
        uVar5 = (pUVar1->original)._content;
        pUVar10 = pUVar2 + index;
        pUVar10->var = pUVar1->var;
        *(undefined4 *)&pUVar10->field_0x4 = uVar6;
        (pUVar10->original)._content = uVar5;
        pUVar2 = pUVar2 + uVar3;
        pUVar2->var = uVar9;
        *(undefined4 *)&pUVar2->field_0x4 = uVar7;
        (pUVar2->original)._content = uVar4;
        index = uVar3;
      }
      else {
        uVar9 = uVar3 | 1;
        CVar8 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>::compare
                          (this->_data1 + index,this->_data1 + uVar9);
        if (CVar8 != GREATER) goto LAB_00313406;
        CVar8 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>::compare
                          (this->_data1 + uVar9,this->_data1 + uVar3);
        pUVar1 = this->_data1;
        pUVar10 = pUVar1 + index;
        if (CVar8 == GREATER) {
          uVar9 = pUVar10->var;
          uVar7 = *(undefined4 *)&pUVar10->field_0x4;
          uVar4 = (pUVar10->original)._content;
          pUVar2 = pUVar1 + uVar3;
          uVar6 = *(undefined4 *)&pUVar2->field_0x4;
          uVar5 = (pUVar2->original)._content;
          pUVar10->var = pUVar2->var;
          *(undefined4 *)&pUVar10->field_0x4 = uVar6;
          (pUVar10->original)._content = uVar5;
          pUVar1 = pUVar1 + uVar3;
          pUVar1->var = uVar9;
          *(undefined4 *)&pUVar1->field_0x4 = uVar7;
          (pUVar1->original)._content = uVar4;
          index = uVar3;
        }
        else {
          uVar3 = pUVar10->var;
          uVar7 = *(undefined4 *)&pUVar10->field_0x4;
          uVar4 = (pUVar10->original)._content;
          pUVar2 = pUVar1 + uVar9;
          uVar6 = *(undefined4 *)&pUVar2->field_0x4;
          uVar5 = (pUVar2->original)._content;
          pUVar10->var = pUVar2->var;
          *(undefined4 *)&pUVar10->field_0x4 = uVar6;
          (pUVar10->original)._content = uVar5;
          pUVar1 = pUVar1 + uVar9;
          pUVar1->var = uVar3;
          *(undefined4 *)&pUVar1->field_0x4 = uVar7;
          (pUVar1->original)._content = uVar4;
          index = uVar9;
        }
      }
      uVar3 = index * 2;
      uVar9 = this->_size;
    } while (uVar3 <= uVar9);
  }
  return index;
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }